

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O1

p_ply ply_open(char *name,p_ply_error_cb error_cb,long idata,void *pdata)

{
  int iVar1;
  p_ply __ptr;
  size_t sVar2;
  gzFile pgVar3;
  FILE *pFVar4;
  code *pcVar5;
  undefined1 auVar6 [32];
  
  __ptr = (p_ply)calloc(1,0x20f8);
  if (__ptr == (p_ply)0x0) {
    __ptr = (p_ply)0x0;
  }
  else {
    __ptr->buffer[0] = '\0';
    auVar6 = ZEXT1632(ZEXT816(0) << 0x40);
    __ptr->element = (p_ply_element)auVar6._0_8_;
    __ptr->nelements = auVar6._8_8_;
    __ptr->comment = (char *)auVar6._16_8_;
    __ptr->ncomments = auVar6._24_8_;
    __ptr->comment = (char *)auVar6._0_8_;
    __ptr->ncomments = auVar6._8_8_;
    __ptr->obj_info = (char *)auVar6._16_8_;
    __ptr->nobj_infos = auVar6._24_8_;
    auVar6 = ZEXT1632(ZEXT816(0) << 0x40);
    __ptr->buffer_first = auVar6._0_8_;
    __ptr->buffer_token = auVar6._8_8_;
    __ptr->buffer_last = auVar6._16_8_;
    __ptr->idriver = (p_ply_idriver)auVar6._24_8_;
    __ptr->odriver = (p_ply_odriver)0x0;
    __ptr->welement = auVar6._0_8_;
    __ptr->wproperty = auVar6._8_8_;
    __ptr->winstance_index = auVar6._16_8_;
    __ptr->wvalue_index = auVar6._24_8_;
    __ptr->wlength = 0;
  }
  pcVar5 = ply_error_cb;
  if (error_cb != (p_ply_error_cb)0x0) {
    pcVar5 = error_cb;
  }
  if (__ptr == (p_ply)0x0) {
    (*pcVar5)((p_ply)0x0,"Out of memory");
    return (p_ply)0x0;
  }
  __ptr->idata = idata;
  __ptr->pdata = pdata;
  __ptr->io_mode = PLY_READ;
  __ptr->error_cb = pcVar5;
  sVar2 = strlen(name);
  if ((((sVar2 < 4) || (name[sVar2 - 3] != '.')) ||
      (iVar1 = tolower((int)name[sVar2 - 2]), iVar1 != 0x67)) ||
     (iVar1 = tolower((int)name[sVar2 - 1]), iVar1 != 0x7a)) {
    pFVar4 = fopen(name,"rb");
    if (pFVar4 == (FILE *)0x0) goto LAB_002c7343;
    pgVar3 = (gzFile)0x0;
  }
  else {
    pgVar3 = (gzFile)gzopen(name,"rb");
    if (pgVar3 == (gzFile)0x0) {
LAB_002c7343:
      (*pcVar5)(__ptr,"Unable to open file");
      free(__ptr);
      return (p_ply)0x0;
    }
    pFVar4 = (FILE *)0x0;
  }
  __ptr->fp = (FILE *)pFVar4;
  __ptr->gzfp = pgVar3;
  return __ptr;
}

Assistant:

p_ply ply_open(const char *name, p_ply_error_cb error_cb, long idata,
               void *pdata) {
    FILE *fp = NULL;
    gzFile gzfp = NULL;
    p_ply ply = ply_alloc();
    if (error_cb == NULL) error_cb = ply_error_cb;
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_READ;
    ply->error_cb = error_cb;
    if (!ply_type_check()) {
        error_cb(ply, "Incompatible type system");
        free(ply);
        return NULL;
    }
    assert(name);
    // Is it gzipped?
    if (strlen(name) > 3 &&
        name[strlen(name)-3] == '.' &&
        std::tolower(name[strlen(name)-2]) == 'g' &&
        std::tolower(name[strlen(name)-1]) == 'z') {
         gzfp = gzopen(name, "rb");
         if (!gzfp) {
            error_cb(ply, "Unable to open file");
            free(ply);
            return NULL;
        }
    }
    else {
        fp = fopen(name, "rb");
        if (!fp) {
            error_cb(ply, "Unable to open file");
            free(ply);
            return NULL;
        }
    }
    ply->fp = fp;
    ply->gzfp = gzfp;
    return ply;
}